

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  QLoggingCategory *pQVar1;
  char *pcVar2;
  QDebug *pQVar3;
  QMessageLogger local_218;
  QDebug local_1f8;
  bool local_1e9;
  undefined1 local_1e8 [7];
  bool qt_category_enabled_5;
  QDebug local_1c8;
  bool local_1b9;
  undefined1 local_1b8 [7];
  bool qt_category_enabled_4;
  QMessageLogger local_1a0;
  QDebug local_180;
  bool local_171;
  undefined1 local_170 [7];
  bool qt_category_enabled_3;
  QDebug local_150;
  bool local_141;
  undefined1 local_140 [7];
  bool qt_category_enabled_2;
  QDebug local_120;
  bool local_111;
  undefined1 local_110 [7];
  bool qt_category_enabled_1;
  QMessageLogger local_f8;
  QDebug local_d8;
  bool local_c9;
  undefined1 local_c8 [7];
  bool qt_category_enabled;
  ExampleConfig example;
  QString local_40;
  QCoreApplication local_28 [8];
  QCoreApplication a;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  QCoreApplication::QCoreApplication(local_28,(int *)&argv_local,argv,0x60204);
  QString::QString(&local_40,"Example config app");
  QCoreApplication::setApplicationName(&local_40);
  QString::~QString(&local_40);
  QString::QString((QString *)&example.exampleString.d.size,"Milo");
  QCoreApplication::setOrganizationName((QString *)&example.exampleString.d.size);
  QString::~QString((QString *)&example.exampleString.d.size);
  ExampleConfig::ExampleConfig((ExampleConfig *)local_c8);
  pQVar1 = coreMain();
  local_c9 = QLoggingCategory::isDebugEnabled(pQVar1);
  while (local_c9 != false) {
    pQVar1 = coreMain();
    pcVar2 = QLoggingCategory::categoryName(pQVar1);
    QMessageLogger::QMessageLogger(&local_f8,(char *)0x0,0,(char *)0x0,pcVar2);
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<(&local_d8,"Application name is:");
    QCoreApplication::applicationName();
    QDebug::operator<<(pQVar3,(QString *)local_110);
    QString::~QString((QString *)local_110);
    QDebug::~QDebug(&local_d8);
    local_c9 = false;
  }
  pQVar1 = coreMain();
  local_111 = QLoggingCategory::isDebugEnabled(pQVar1);
  while (local_111 != false) {
    pQVar1 = coreMain();
    pcVar2 = QLoggingCategory::categoryName(pQVar1);
    QMessageLogger::QMessageLogger((QMessageLogger *)local_140,(char *)0x0,0,(char *)0x0,pcVar2);
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<(&local_120,"Example value is:");
    QDebug::operator<<(pQVar3,(int)example.super_MConfig.mValues.d);
    QDebug::~QDebug(&local_120);
    local_111 = false;
  }
  pQVar1 = coreMain();
  local_141 = QLoggingCategory::isDebugEnabled(pQVar1);
  while (local_141 != false) {
    pQVar1 = coreMain();
    pcVar2 = QLoggingCategory::categoryName(pQVar1);
    QMessageLogger::QMessageLogger((QMessageLogger *)local_170,(char *)0x0,0,(char *)0x0,pcVar2);
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<(&local_150,"Example string is:");
    QDebug::operator<<(pQVar3,(QByteArray *)&example.exampleValue);
    QDebug::~QDebug(&local_150);
    local_141 = false;
  }
  pQVar1 = coreMain();
  local_171 = QLoggingCategory::isDebugEnabled(pQVar1);
  while (local_171 != false) {
    pQVar1 = coreMain();
    pcVar2 = QLoggingCategory::categoryName(pQVar1);
    QMessageLogger::QMessageLogger(&local_1a0,(char *)0x0,0,(char *)0x0,pcVar2);
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<(&local_180,"Config file would be saved to:");
    MBaseConfig::filePath((QString *)local_1b8,(MBaseConfig *)local_c8);
    QDebug::operator<<(pQVar3,(QString *)local_1b8);
    QString::~QString((QString *)local_1b8);
    QDebug::~QDebug(&local_180);
    local_171 = false;
  }
  pQVar1 = coreMain();
  local_1b9 = QLoggingCategory::isDebugEnabled(pQVar1);
  while (local_1b9 != false) {
    pQVar1 = coreMain();
    pcVar2 = QLoggingCategory::categoryName(pQVar1);
    QMessageLogger::QMessageLogger((QMessageLogger *)local_1e8,(char *)0x0,0,(char *)0x0,pcVar2);
    QMessageLogger::debug();
    QDebug::operator<<(&local_1c8,
                       "Uncomment load and save in ExampleConfig class if you actually want to create and use config file. "
                      );
    QDebug::~QDebug(&local_1c8);
    local_1b9 = false;
  }
  pQVar1 = coreMain();
  local_1e9 = QLoggingCategory::isDebugEnabled(pQVar1);
  while (local_1e9 != false) {
    pQVar1 = coreMain();
    pcVar2 = QLoggingCategory::categoryName(pQVar1);
    QMessageLogger::QMessageLogger(&local_218,(char *)0x0,0,(char *)0x0,pcVar2);
    QMessageLogger::debug();
    QDebug::operator<<(&local_1f8,
                       "If you want to encrypt your config add mcrypto to the project and enable build option: mconfig-crypto"
                      );
    QDebug::~QDebug(&local_1f8);
    local_1e9 = false;
  }
  argv_local._4_4_ = 0;
  ExampleConfig::~ExampleConfig((ExampleConfig *)local_c8);
  QCoreApplication::~QCoreApplication(local_28);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    QCoreApplication a(argc, argv);
    a.setApplicationName("Example config app");
    a.setOrganizationName("Milo");

    ExampleConfig example;
    qCDebug(coreMain) << "Application name is:" << a.applicationName();
    qCDebug(coreMain) << "Example value is:" << example.exampleValue;
    qCDebug(coreMain) << "Example string is:" << example.exampleString;
    qCDebug(coreMain) << "Config file would be saved to:" << example.filePath();
    qCDebug(coreMain) << "Uncomment load and save in ExampleConfig class if you actually want to create and use config file. ";
    qCDebug(coreMain) << "If you want to encrypt your config add mcrypto to the project and enable build option: mconfig-crypto";

    return 0;
}